

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O0

void __thiscall
OSSLEVPSymmetricAlgorithm::~OSSLEVPSymmetricAlgorithm(OSSLEVPSymmetricAlgorithm *this)

{
  code *pcVar1;
  OSSLEVPSymmetricAlgorithm *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

OSSLEVPSymmetricAlgorithm::~OSSLEVPSymmetricAlgorithm()
{
	/* In case of custom allocator from BIND, even NULL pointer might crash
	 * the library if freed after deinitialization. Do not rely on null handling
	 * as a workaround. */
	if (pCurCTX)
		EVP_CIPHER_CTX_free(pCurCTX);
	if (maximumBytes)
		BN_free(maximumBytes);
	if (counterBytes)
		BN_free(counterBytes);
}